

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

Xt __thiscall
cppforth::Forth::findDefinitionByWid(Forth *this,CAddr nameToFind,Cell nameLength,SCell wid)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  reference pcVar4;
  reference this_00;
  size_type sVar5;
  string *name;
  Definition *defn;
  reverse_iterator iend;
  reverse_iterator i;
  char *c;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string Word1;
  SCell wid_local;
  Cell nameLength_local;
  CAddr nameToFind_local;
  Forth *this_local;
  
  if (nameLength == 0) {
    this_local._4_4_ = 0;
  }
  else {
    Word1.field_2._12_4_ = wid;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_48,(ulong)nameLength,' ',&local_49);
    std::allocator<char>::~allocator(&local_49);
    moveFromDataSpace(this,(string *)local_48,nameToFind,(ulong)nameLength);
    __end2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_48);
    c = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_48);
    while (bVar1 = __gnu_cxx::
                   operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             (&__end2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&c), ((bVar1 ^ 0xffU) & 1) != 0) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      cVar2 = toupper_ascii(*pcVar4);
      *pcVar4 = cVar2;
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::rbegin
              ((vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_> *)
               &iend);
    std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::rend
              ((vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_> *)
               &defn);
    while (bVar1 = std::
                   operator==<__gnu_cxx::__normal_iterator<cppforth::Forth::Definition_*,_std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>_>_>
                             (&iend,(reverse_iterator<__gnu_cxx::__normal_iterator<cppforth::Forth::Definition_*,_std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>_>_>
                                     *)&defn), ((bVar1 ^ 0xffU) & 1) != 0) {
      this_00 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<cppforth::Forth::Definition_*,_std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>_>_>
                ::operator*(&iend);
      bVar1 = Definition::isHidden(this_00);
      if ((!bVar1) && (this_00->searchOrder == Word1.field_2._12_4_)) {
        sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                length(&this_00->name);
        if ((nameLength == sVar5) &&
           (iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,&this_00->name), iVar3 == 0)) {
          this_local._4_4_ = this_00->numberInVector;
          goto LAB_0014796d;
        }
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<cppforth::Forth::Definition_*,_std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>_>_>
      ::operator++(&iend);
    }
    this_local._4_4_ = 0;
LAB_0014796d:
    std::__cxx11::string::~string((string *)local_48);
  }
  return this_local._4_4_;
}

Assistant:

Xt findDefinitionByWid(CAddr nameToFind, Cell nameLength,SCell wid) {
			if (nameLength == 0)
				return 0;
			std::string Word1(nameLength,' ');
			moveFromDataSpace(Word1, nameToFind, nameLength);
			for (auto & c: Word1) c = toupper_ascii(static_cast<unsigned char>(c));
			for (auto i = definitions.rbegin(), iend=definitions.rend(); i != iend ; ++i) {
				auto& defn = *i;
				//if (!defn.isFindable())
				if (defn.isHidden())
					continue;
				if(defn.searchOrder!=wid)
				 	continue;		
				auto& name = defn.name;
				if(nameLength==name.length() && Word1.compare(name)==0) {
					return defn.numberInVector; 
				}
			}
			return 0;
		}